

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

void preptypeinfo(rnndb *db,rnntypeinfo *ti,char *prefix,rnnvarinfo *vi,int width,char *file)

{
  int iVar1;
  char *pcVar2;
  rnnvalue *prVar3;
  char *pcVar4;
  char *pcVar5;
  rnnenum *prVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  rnnenum *prVar11;
  rnnbitset *prVar12;
  rnnspectype *prVar13;
  rnnvalue **__ptr;
  rnnvalue *prVar14;
  rnnbitfield **pprVar15;
  rnnbitfield *prVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  
  pcVar2 = ti->name;
  if (pcVar2 == (char *)0x0) {
    if (ti->bitfieldsnum == 0) {
      if (ti->valsnum != 0) {
        ti->name = "enum";
LAB_00106c3e:
        ti->type = RNN_TTYPE_INLINE_ENUM;
        goto LAB_00106d7a;
      }
      if (width == 1) {
        ti->name = "boolean";
LAB_00106c86:
        ti->type = RNN_TTYPE_BOOLEAN;
        goto LAB_00106d7a;
      }
      ti->name = "hex";
LAB_00106d72:
      ti->type = RNN_TTYPE_HEX;
      goto LAB_00106d7a;
    }
    ti->name = "bitfield";
  }
  else {
    prVar11 = rnn_findenum(db,pcVar2);
    prVar12 = rnn_findbitset(db,pcVar2);
    prVar13 = rnn_findspectype(db,pcVar2);
    if (prVar11 != (rnnenum *)0x0) {
      if (prVar11->isinline == 0) {
        ti->type = RNN_TTYPE_ENUM;
        ti->eenum = prVar11;
      }
      else {
        ti->type = RNN_TTYPE_INLINE_ENUM;
        iVar17 = prVar11->valsnum;
        if (0 < iVar17) {
          iVar19 = ti->valsnum;
          lVar20 = 0;
          do {
            iVar1 = ti->valsmax;
            __ptr = ti->vals;
            if (iVar1 <= iVar19) {
              iVar17 = iVar1 * 2;
              if (iVar1 == 0) {
                iVar17 = 0x10;
              }
              ti->valsmax = iVar17;
              __ptr = (rnnvalue **)realloc(__ptr,(long)iVar17 << 3);
              ti->vals = __ptr;
              iVar19 = ti->valsnum;
              iVar17 = prVar11->valsnum;
            }
            prVar3 = prVar11->vals[lVar20];
            prVar14 = (rnnvalue *)calloc(0x68,1);
            prVar14->name = prVar3->name;
            prVar14->valvalid = prVar3->valvalid;
            prVar14->value = prVar3->value;
            pcVar2 = (prVar3->varinfo).prefixstr;
            pcVar4 = (prVar3->varinfo).varsetstr;
            pcVar5 = (prVar3->varinfo).variantsstr;
            iVar9 = (prVar3->varinfo).dead;
            uVar10 = *(undefined4 *)&(prVar3->varinfo).field_0x1c;
            prVar6 = (prVar3->varinfo).prefenum;
            pcVar7 = (prVar3->varinfo).prefix;
            iVar1 = (prVar3->varinfo).varsetsnum;
            iVar8 = (prVar3->varinfo).varsetsmax;
            (prVar14->varinfo).varsets = (prVar3->varinfo).varsets;
            (prVar14->varinfo).varsetsnum = iVar1;
            (prVar14->varinfo).varsetsmax = iVar8;
            (prVar14->varinfo).prefenum = prVar6;
            (prVar14->varinfo).prefix = pcVar7;
            (prVar14->varinfo).variantsstr = pcVar5;
            (prVar14->varinfo).dead = iVar9;
            *(undefined4 *)&(prVar14->varinfo).field_0x1c = uVar10;
            (prVar14->varinfo).prefixstr = pcVar2;
            (prVar14->varinfo).varsetstr = pcVar4;
            prVar14->file = file;
            lVar18 = (long)iVar19;
            iVar19 = iVar19 + 1;
            ti->valsnum = iVar19;
            __ptr[lVar18] = prVar14;
            lVar20 = lVar20 + 1;
          } while (lVar20 < iVar17);
        }
      }
      goto LAB_00106d7a;
    }
    if (prVar12 != (rnnbitset *)0x0) {
      if (prVar12->isinline == 0) {
        ti->type = RNN_TTYPE_BITSET;
        ti->ebitset = prVar12;
      }
      else {
        ti->type = RNN_TTYPE_INLINE_BITSET;
        if (0 < prVar12->bitfieldsnum) {
          iVar17 = ti->bitfieldsnum;
          lVar20 = 0;
          do {
            iVar19 = ti->bitfieldsmax;
            if (iVar19 <= iVar17) {
              iVar17 = iVar19 * 2;
              if (iVar19 == 0) {
                iVar17 = 0x10;
              }
              ti->bitfieldsmax = iVar17;
              pprVar15 = (rnnbitfield **)realloc(ti->bitfields,(long)iVar17 << 3);
              ti->bitfields = pprVar15;
            }
            prVar16 = copybitfield(prVar12->bitfields[lVar20],file);
            iVar19 = ti->bitfieldsnum;
            iVar17 = iVar19 + 1;
            ti->bitfieldsnum = iVar17;
            ti->bitfields[iVar19] = prVar16;
            lVar20 = lVar20 + 1;
          } while (lVar20 < prVar12->bitfieldsnum);
        }
      }
      goto LAB_00106d7a;
    }
    if (prVar13 != (rnnspectype *)0x0) {
      ti->type = RNN_TTYPE_SPECTYPE;
      ti->spectype = prVar13;
      goto LAB_00106d7a;
    }
    iVar17 = strcmp(pcVar2,"hex");
    if (iVar17 == 0) goto LAB_00106d72;
    iVar17 = strcmp(pcVar2,"float");
    if (iVar17 == 0) {
      ti->type = RNN_TTYPE_FLOAT;
      goto LAB_00106d7a;
    }
    iVar17 = strcmp(pcVar2,"uint");
    if (iVar17 == 0) {
      ti->type = RNN_TTYPE_UINT;
      goto LAB_00106d7a;
    }
    iVar17 = strcmp(pcVar2,"int");
    if (iVar17 == 0) {
      ti->type = RNN_TTYPE_INT;
      goto LAB_00106d7a;
    }
    iVar17 = strcmp(pcVar2,"boolean");
    if (iVar17 == 0) goto LAB_00106c86;
    iVar17 = strcmp(pcVar2,"bitfield");
    if (iVar17 != 0) {
      iVar17 = strcmp(pcVar2,"enum");
      if (iVar17 != 0) {
        ti->type = RNN_TTYPE_HEX;
        fprintf(_stderr,"%s: unknown type %s\n",prefix,pcVar2);
        db->estatus = 1;
        goto LAB_00106d7a;
      }
      goto LAB_00106c3e;
    }
  }
  ti->type = RNN_TTYPE_INLINE_BITSET;
LAB_00106d7a:
  if (0 < ti->bitfieldsnum) {
    lVar20 = 0;
    do {
      prepbitfield(db,ti->bitfields[lVar20],prefix,vi);
      lVar20 = lVar20 + 1;
    } while (lVar20 < ti->bitfieldsnum);
  }
  if (0 < ti->valsnum) {
    lVar20 = 0;
    do {
      prepvalue(db,ti->vals[lVar20],prefix,vi);
      lVar20 = lVar20 + 1;
    } while (lVar20 < ti->valsnum);
  }
  return;
}

Assistant:

static void preptypeinfo(struct rnndb *db, struct rnntypeinfo *ti, char *prefix, struct rnnvarinfo *vi, int width, char *file) {
	int i;
	if (ti->name) {
		struct rnnenum *en = rnn_findenum (db, ti->name);
		struct rnnbitset *bs = rnn_findbitset (db, ti->name);
		struct rnnspectype *st = rnn_findspectype (db, ti->name);
		if (en) {
			if (en->isinline) {
				ti->type = RNN_TTYPE_INLINE_ENUM;
				int j;
				for (j = 0; j < en->valsnum; j++)
					ADDARRAY(ti->vals, copyvalue(en->vals[j], file));
			} else {
				ti->type = RNN_TTYPE_ENUM;
				ti->eenum = en;
			}
		} else if (bs) {
			if (bs->isinline) {
				ti->type = RNN_TTYPE_INLINE_BITSET;
				int j;
				for (j = 0; j < bs->bitfieldsnum; j++)
					ADDARRAY(ti->bitfields, copybitfield(bs->bitfields[j], file));
			} else {
				ti->type = RNN_TTYPE_BITSET;
				ti->ebitset = bs;
			}
		} else if (st) {
			ti->type = RNN_TTYPE_SPECTYPE;
			ti->spectype = st;
		} else if (!strcmp(ti->name, "hex")) {
			ti->type = RNN_TTYPE_HEX;
		} else if (!strcmp(ti->name, "float")) {
			ti->type = RNN_TTYPE_FLOAT;
		} else if (!strcmp(ti->name, "uint")) {
			ti->type = RNN_TTYPE_UINT;
		} else if (!strcmp(ti->name, "int")) {
			ti->type = RNN_TTYPE_INT;
		} else if (!strcmp(ti->name, "boolean")) {
			ti->type = RNN_TTYPE_BOOLEAN;
		} else if (!strcmp(ti->name, "bitfield")) {
			ti->type = RNN_TTYPE_INLINE_BITSET;
		} else if (!strcmp(ti->name, "enum")) {
			ti->type = RNN_TTYPE_INLINE_ENUM;
		} else {
			ti->type = RNN_TTYPE_HEX;
			fprintf (stderr, "%s: unknown type %s\n", prefix, ti->name);
			db->estatus = 1;
		}
	} else if (ti->bitfieldsnum) {
		ti->name = "bitfield";
		ti->type = RNN_TTYPE_INLINE_BITSET;
	} else if (ti->valsnum) {
		ti->name = "enum";
		ti->type = RNN_TTYPE_INLINE_ENUM;
	} else if (width == 1) {
		ti->name = "boolean";
		ti->type = RNN_TTYPE_BOOLEAN;
	} else {
		ti->name = "hex";
		ti->type = RNN_TTYPE_HEX;
	}
	for (i = 0; i < ti->bitfieldsnum; i++)
		prepbitfield(db,  ti->bitfields[i], prefix, vi);
	for (i = 0; i < ti->valsnum; i++)
		prepvalue(db, ti->vals[i], prefix, vi);
}